

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::DataTypeApplyOp(ImGuiDataType data_type,int op,void *output,void *arg1,void *arg2)

{
  uchar uVar1;
  unsigned_short uVar2;
  float fVar3;
  double dVar4;
  double *in_RCX;
  double *in_RDX;
  int in_ESI;
  undefined4 in_EDI;
  double *in_R8;
  
  switch(in_EDI) {
  case 0:
    if (in_ESI == 0x2b) {
      uVar1 = ImAddClampOverflow<signed_char>(*(char *)in_RCX,*(char *)in_R8,-0x80,'\x7f');
      *(uchar *)in_RDX = uVar1;
    }
    if (in_ESI == 0x2d) {
      uVar1 = ImSubClampOverflow<signed_char>(*(char *)in_RCX,*(char *)in_R8,-0x80,'\x7f');
      *(uchar *)in_RDX = uVar1;
    }
    break;
  case 1:
    if (in_ESI == 0x2b) {
      uVar1 = ImAddClampOverflow<unsigned_char>(*(uchar *)in_RCX,*(uchar *)in_R8,'\0',0xff);
      *(uchar *)in_RDX = uVar1;
    }
    if (in_ESI == 0x2d) {
      uVar1 = ImSubClampOverflow<unsigned_char>(*(uchar *)in_RCX,*(uchar *)in_R8,'\0',0xff);
      *(uchar *)in_RDX = uVar1;
    }
    break;
  case 2:
    if (in_ESI == 0x2b) {
      uVar2 = ImAddClampOverflow<short>(*(short *)in_RCX,*(short *)in_R8,-0x8000,0x7fff);
      *(unsigned_short *)in_RDX = uVar2;
    }
    if (in_ESI == 0x2d) {
      uVar2 = ImSubClampOverflow<short>(*(short *)in_RCX,*(short *)in_R8,-0x8000,0x7fff);
      *(unsigned_short *)in_RDX = uVar2;
    }
    break;
  case 3:
    if (in_ESI == 0x2b) {
      uVar2 = ImAddClampOverflow<unsigned_short>
                        (*(unsigned_short *)in_RCX,*(unsigned_short *)in_R8,0,0xffff);
      *(unsigned_short *)in_RDX = uVar2;
    }
    if (in_ESI == 0x2d) {
      uVar2 = ImSubClampOverflow<unsigned_short>
                        (*(unsigned_short *)in_RCX,*(unsigned_short *)in_R8,0,0xffff);
      *(unsigned_short *)in_RDX = uVar2;
    }
    break;
  case 4:
    if (in_ESI == 0x2b) {
      fVar3 = (float)ImAddClampOverflow<int>
                               ((int)*(float *)in_RCX,(int)*(float *)in_R8,-0x80000000,0x7fffffff);
      *(float *)in_RDX = fVar3;
    }
    if (in_ESI == 0x2d) {
      fVar3 = (float)ImSubClampOverflow<int>
                               ((int)*(float *)in_RCX,(int)*(float *)in_R8,-0x80000000,0x7fffffff);
      *(float *)in_RDX = fVar3;
    }
    break;
  case 5:
    if (in_ESI == 0x2b) {
      fVar3 = (float)ImAddClampOverflow<unsigned_int>
                               ((uint)*(float *)in_RCX,(uint)*(float *)in_R8,0,0xffffffff);
      *(float *)in_RDX = fVar3;
    }
    if (in_ESI == 0x2d) {
      fVar3 = (float)ImSubClampOverflow<unsigned_int>
                               ((uint)*(float *)in_RCX,(uint)*(float *)in_R8,0,0xffffffff);
      *(float *)in_RDX = fVar3;
    }
    break;
  case 6:
    if (in_ESI == 0x2b) {
      dVar4 = (double)ImAddClampOverflow<long_long>
                                ((longlong)*in_RCX,(longlong)*in_R8,-0x8000000000000000,
                                 0x7fffffffffffffff);
      *in_RDX = dVar4;
    }
    if (in_ESI == 0x2d) {
      dVar4 = (double)ImSubClampOverflow<long_long>
                                ((longlong)*in_RCX,(longlong)*in_R8,-0x8000000000000000,
                                 0x7fffffffffffffff);
      *in_RDX = dVar4;
    }
    break;
  case 7:
    if (in_ESI == 0x2b) {
      dVar4 = (double)ImAddClampOverflow<unsigned_long_long>
                                ((unsigned_long_long)*in_RCX,(unsigned_long_long)*in_R8,0,
                                 0xffffffffffffffff);
      *in_RDX = dVar4;
    }
    if (in_ESI == 0x2d) {
      dVar4 = (double)ImSubClampOverflow<unsigned_long_long>
                                ((unsigned_long_long)*in_RCX,(unsigned_long_long)*in_R8,0,
                                 0xffffffffffffffff);
      *in_RDX = dVar4;
    }
    break;
  case 8:
    if (in_ESI == 0x2b) {
      *(float *)in_RDX = *(float *)in_RCX + *(float *)in_R8;
    }
    if (in_ESI == 0x2d) {
      *(float *)in_RDX = *(float *)in_RCX - *(float *)in_R8;
    }
    break;
  case 9:
    if (in_ESI == 0x2b) {
      *in_RDX = *in_RCX + *in_R8;
    }
    if (in_ESI == 0x2d) {
      *in_RDX = *in_RCX - *in_R8;
    }
    break;
  case 10:
  }
  return;
}

Assistant:

void ImGui::DataTypeApplyOp(ImGuiDataType data_type, int op, void* output, const void* arg1, const void* arg2)
{
    IM_ASSERT(op == '+' || op == '-');
    switch (data_type)
    {
        case ImGuiDataType_S8:
            if (op == '+') { *(ImS8*)output  = ImAddClampOverflow(*(const ImS8*)arg1,  *(const ImS8*)arg2,  IM_S8_MIN,  IM_S8_MAX); }
            if (op == '-') { *(ImS8*)output  = ImSubClampOverflow(*(const ImS8*)arg1,  *(const ImS8*)arg2,  IM_S8_MIN,  IM_S8_MAX); }
            return;
        case ImGuiDataType_U8:
            if (op == '+') { *(ImU8*)output  = ImAddClampOverflow(*(const ImU8*)arg1,  *(const ImU8*)arg2,  IM_U8_MIN,  IM_U8_MAX); }
            if (op == '-') { *(ImU8*)output  = ImSubClampOverflow(*(const ImU8*)arg1,  *(const ImU8*)arg2,  IM_U8_MIN,  IM_U8_MAX); }
            return;
        case ImGuiDataType_S16:
            if (op == '+') { *(ImS16*)output = ImAddClampOverflow(*(const ImS16*)arg1, *(const ImS16*)arg2, IM_S16_MIN, IM_S16_MAX); }
            if (op == '-') { *(ImS16*)output = ImSubClampOverflow(*(const ImS16*)arg1, *(const ImS16*)arg2, IM_S16_MIN, IM_S16_MAX); }
            return;
        case ImGuiDataType_U16:
            if (op == '+') { *(ImU16*)output = ImAddClampOverflow(*(const ImU16*)arg1, *(const ImU16*)arg2, IM_U16_MIN, IM_U16_MAX); }
            if (op == '-') { *(ImU16*)output = ImSubClampOverflow(*(const ImU16*)arg1, *(const ImU16*)arg2, IM_U16_MIN, IM_U16_MAX); }
            return;
        case ImGuiDataType_S32:
            if (op == '+') { *(ImS32*)output = ImAddClampOverflow(*(const ImS32*)arg1, *(const ImS32*)arg2, IM_S32_MIN, IM_S32_MAX); }
            if (op == '-') { *(ImS32*)output = ImSubClampOverflow(*(const ImS32*)arg1, *(const ImS32*)arg2, IM_S32_MIN, IM_S32_MAX); }
            return;
        case ImGuiDataType_U32:
            if (op == '+') { *(ImU32*)output = ImAddClampOverflow(*(const ImU32*)arg1, *(const ImU32*)arg2, IM_U32_MIN, IM_U32_MAX); }
            if (op == '-') { *(ImU32*)output = ImSubClampOverflow(*(const ImU32*)arg1, *(const ImU32*)arg2, IM_U32_MIN, IM_U32_MAX); }
            return;
        case ImGuiDataType_S64:
            if (op == '+') { *(ImS64*)output = ImAddClampOverflow(*(const ImS64*)arg1, *(const ImS64*)arg2, IM_S64_MIN, IM_S64_MAX); }
            if (op == '-') { *(ImS64*)output = ImSubClampOverflow(*(const ImS64*)arg1, *(const ImS64*)arg2, IM_S64_MIN, IM_S64_MAX); }
            return;
        case ImGuiDataType_U64:
            if (op == '+') { *(ImU64*)output = ImAddClampOverflow(*(const ImU64*)arg1, *(const ImU64*)arg2, IM_U64_MIN, IM_U64_MAX); }
            if (op == '-') { *(ImU64*)output = ImSubClampOverflow(*(const ImU64*)arg1, *(const ImU64*)arg2, IM_U64_MIN, IM_U64_MAX); }
            return;
        case ImGuiDataType_Float:
            if (op == '+') { *(float*)output = *(const float*)arg1 + *(const float*)arg2; }
            if (op == '-') { *(float*)output = *(const float*)arg1 - *(const float*)arg2; }
            return;
        case ImGuiDataType_Double:
            if (op == '+') { *(double*)output = *(const double*)arg1 + *(const double*)arg2; }
            if (op == '-') { *(double*)output = *(const double*)arg1 - *(const double*)arg2; }
            return;
        case ImGuiDataType_COUNT: break;
    }
    IM_ASSERT(0);
}